

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_Test1DLinearResourceArrays_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceArrays_Test *this)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  uint32_t AlignedSize;
  uint32_t PitchInBytes;
  uint32_t AlignedWidth;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t HAlign;
  CTestGen9Resource_Test1DLinearResourceArrays_Test *this_local;
  
  gmmParams.MultiTileArch.Reserved = 0x40;
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_16;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xfffffffffff7ffff | 0x80000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  gmmParams.Depth = 4;
  for (ResourceInfo._4_4_ = TEST_BPP_8; ResourceInfo._4_4_ < TEST_BPP_MAX;
      ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 0x1001;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&bpp);
    uVar1 = (gmmParams.CpTag + 0x3f) - (gmmParams.CpTag + 0x3f & 0x3f);
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo._4_4_);
    iVar3 = uVar1 * uVar2;
    iVar4 = iVar3 * gmmParams.Depth;
    iVar3 = iVar3 * gmmParams.Depth;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo_00,0x40);
    CTestResource::VerifyResourceVAlign<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourcePitch<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourcePitchInTiles<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo_00,
               (ulong)((iVar4 + 0xfff) - (iVar3 + 0xfffU & 0xfff)));
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo_00,(ulong)uVar1);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceArrays)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1001;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes * gmmParams.ArraySize, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<true>(ResourceInfo, AlignedWidth);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}